

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address-conversion.cc
# Opt level: O1

string * num2mac_abi_cxx11_(string *__return_storage_ptr__,uint64_t i)

{
  long lVar1;
  char cVar2;
  char cVar3;
  long lVar4;
  ulong uVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> nums;
  stringstream ss;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1c8;
  uint local_1b0 [4];
  long local_1a0 [2];
  undefined8 uStack_190;
  uint auStack_188 [22];
  ios_base local_130 [112];
  char acStack_c0 [152];
  
  local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  lVar4 = 5;
  do {
    uVar5 = i;
    local_1b0[0] = (uint)uVar5 & 0xff;
    if (local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_1c8,
                 (iterator)
                 local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,local_1b0);
    }
    else {
      *local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = local_1b0[0];
      local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    lVar4 = lVar4 + -1;
    i = uVar5 >> 8;
  } while (lVar4 != 0);
  local_1b0[0] = (uint)(uVar5 >> 8);
  if (local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_1c8,
               (iterator)
               local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_1b0);
  }
  else {
    *local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = local_1b0[0];
    local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
  *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
       *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
  lVar4 = 0x14;
  do {
    lVar1 = *(long *)(local_1a0[0] + -0x18);
    cVar3 = (char)(ostream *)local_1a0;
    if (acStack_c0[lVar1 + 1] == '\0') {
      cVar2 = std::ios::widen(cVar3 + (char)lVar1);
      acStack_c0[lVar1] = cVar2;
      acStack_c0[lVar1 + 1] = '\x01';
    }
    acStack_c0[lVar1] = '0';
    *(undefined8 *)((long)&uStack_190 + *(long *)(local_1a0[0] + -0x18)) = 2;
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
    lVar4 = lVar4 + -4;
  } while (lVar4 != 0);
  lVar4 = *(long *)(local_1a0[0] + -0x18);
  if (acStack_c0[lVar4 + 1] == '\0') {
    cVar3 = std::ios::widen(cVar3 + (char)lVar4);
    acStack_c0[lVar4] = cVar3;
    acStack_c0[lVar4 + 1] = '\x01';
  }
  acStack_c0[lVar4] = '0';
  *(undefined8 *)((long)&uStack_190 + *(long *)(local_1a0[0] + -0x18)) = 2;
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
  std::ios_base::~ios_base(local_130);
  if (local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string num2mac(uint64_t i)
{
    std::vector<uint32_t> nums;
    for (size_t j = 0; j < 5; ++j)
    {
        nums.push_back(i % 0x100);
        i = (i - i % 0x100) / 0x100;
    }
    nums.push_back(i);

    std::stringstream ss;
    ss << std::hex;
    for (size_t i = 5; i > 0; --i)
    {
        ss << std::setfill('0') << std::setw(2) << nums[i];
        ss << ":";
    }
    ss << std::setfill('0') << std::setw(2) << nums[0];
    return ss.str();
}